

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  cmMakefile *makefile;
  pointer pcVar1;
  TargetType TVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  char *__s2;
  long lVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  string targetName;
  string compiler;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  string make;
  string fastTarget;
  char *in_stack_ffffffffffffff00;
  string local_e8;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_c8;
  cmExtraSublimeTextGenerator *local_c0;
  cmGeneratedFileStream *local_b8;
  MapSourceFileFlags *local_b0;
  string local_a8;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_88;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_c8 = lgs;
  local_c0 = this;
  local_b8 = fout;
  local_b0 = sourceFileFlags;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_MAKE_PROGRAM","");
  pcVar4 = cmMakefile::GetRequiredDefinition(mf,&local_a8);
  std::__cxx11::string::string((string *)local_70,pcVar4,(allocator *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  if ((local_c8->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (local_c8->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"all","");
    AppendTarget(local_c0,local_b8,&local_e8,
                 *(local_c8->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (char *)local_70[0],mf,in_stack_ffffffffffffff00,local_b0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"clean","");
    AppendTarget(local_c0,local_b8,&local_e8,
                 *(local_c8->
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                  _M_impl.super__Vector_impl_data._M_start,(cmGeneratorTarget *)0x0,
                 (char *)local_70[0],mf,in_stack_ffffffffffffff00,local_b0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    ppcVar7 = (local_c8->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar7 !=
        (local_c8->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      do {
        makefile = (*ppcVar7)->Makefile;
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
                  (&local_88,&(*ppcVar7)->GeneratorTargets);
        ppcVar8 = local_88.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_88.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_88.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          do {
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar8);
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
            pcVar1 = (psVar5->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,pcVar1,pcVar1 + psVar5->_M_string_length);
            TVar2 = cmGeneratorTarget::GetType(*ppcVar8);
            if (TVar2 < UTILITY) {
              AppendTarget(local_c0,local_b8,&local_e8,*ppcVar7,*ppcVar8,(char *)local_70[0],
                           makefile,in_stack_ffffffffffffff00,local_b0,false);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,local_e8._M_dataplus._M_p,
                         local_e8._M_dataplus._M_p + local_e8._M_string_length);
              std::__cxx11::string::append((char *)&local_50);
              AppendTarget(local_c0,local_b8,&local_50,*ppcVar7,*ppcVar8,(char *)local_70[0],
                           makefile,in_stack_ffffffffffffff00,local_b0,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else if (TVar2 == UTILITY) {
              lVar6 = std::__cxx11::string::find((char *)&local_e8,0x52092a,0);
              if (((lVar6 != 0) ||
                  (iVar3 = std::__cxx11::string::compare((char *)&local_e8), iVar3 == 0)) &&
                 ((lVar6 = std::__cxx11::string::find((char *)&local_e8,0x520932,0), lVar6 != 0 ||
                  (iVar3 = std::__cxx11::string::compare((char *)&local_e8), iVar3 == 0)))) {
                lVar6 = std::__cxx11::string::find((char *)&local_e8,0x52093d,0);
                if (lVar6 == 0) {
                  iVar3 = std::__cxx11::string::compare((char *)&local_e8);
                  goto LAB_003bf580;
                }
LAB_003bf5df:
                AppendTarget(local_c0,local_b8,&local_e8,*ppcVar7,(cmGeneratorTarget *)0x0,
                             (char *)local_70[0],makefile,in_stack_ffffffffffffff00,local_b0,false);
              }
            }
            else if (TVar2 == GLOBAL_TARGET) {
              pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory(*ppcVar7);
              __s2 = cmLocalGenerator::GetBinaryDirectory(*ppcVar7);
              iVar3 = strcmp(pcVar4,__s2);
LAB_003bf580:
              if (iVar3 == 0) goto LAB_003bf5df;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            ppcVar8 = ppcVar8 + 1;
          } while (ppcVar8 !=
                   local_88.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        if (local_88.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        ppcVar7 = ppcVar7 + 1;
      } while (ppcVar7 !=
               (local_c8->
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::
  AppendAllTargets(const std::vector<cmLocalGenerator*>& lgs,
                   const cmMakefile* mf,
                   cmGeneratedFileStream& fout,
                   MapSourceFileFlags& sourceFileFlags)
{
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = "";
  if (!lgs.empty())
    {
      this->AppendTarget(fout, "all", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, true);
      this->AppendTarget(fout, "clean", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, false);
    }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    std::vector<cmGeneratorTarget*> targets=(*lg)->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      std::string targetName = (*ti)->GetName();
      switch((*ti)->GetType())
        {
        case cmState::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp((*lg)->GetCurrentBinaryDirectory(),
                     (*lg)->GetBinaryDirectory())==0)
            {
            this->AppendTarget(fout, targetName, *lg, 0,
                               make.c_str(), makefile, compiler.c_str(),
                               sourceFileFlags, false);
            }
          }
          break;
        case cmState::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((targetName.find("Nightly")==0)   &&(targetName!="Nightly"))
             || ((targetName.find("Continuous")==0)
                 &&(targetName!="Continuous"))
             || ((targetName.find("Experimental")==0)
                 && (targetName!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, targetName, *lg, 0,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          break;
        case cmState::EXECUTABLE:
        case cmState::STATIC_LIBRARY:
        case cmState::SHARED_LIBRARY:
        case cmState::MODULE_LIBRARY:
        case cmState::OBJECT_LIBRARY:
          {
          this->AppendTarget(fout, targetName, *lg, *ti,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          std::string fastTarget = targetName;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, *lg, *ti,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          }
          break;
        default:
          break;
        }
      }
    }
}